

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O0

void __thiscall Enterprise::Nick::run_for(Nick *this,Cycles duration)

{
  Mode MVar1;
  uint16_t uVar2;
  int *piVar3;
  uint16_t *puVar4;
  ulong uVar5;
  int iVar6;
  OutputType OVar7;
  int local_4c;
  int local_48;
  int local_44;
  int output_duration;
  int columns_remaining;
  int next_event_1;
  int base;
  int next_event;
  uint8_t flags_1;
  int iStack_2c;
  uint8_t flags;
  int end_window;
  int window;
  int local_20;
  int clocks_this_line;
  int clocks_remaining;
  int line_length;
  Nick *this_local;
  Cycles duration_local;
  
  clocks_this_line = 0x390;
  _clocks_remaining = this;
  this_local = (Nick *)duration.super_WrappedInt<Cycles>.length_;
  local_20 = WrappedInt<Cycles>::as<int>((WrappedInt<Cycles> *)&this_local);
LAB_0074ddce:
  do {
    do {
      do {
        if (local_20 == 0) {
          return;
        }
        end_window = 0x390 - this->horizontal_counter_;
        piVar3 = std::min<int>(&local_20,&end_window);
        window = *piVar3;
        iStack_2c = this->horizontal_counter_ >> 4;
        next_event = this->horizontal_counter_ + window >> 4;
        local_20 = local_20 - window;
        this->horizontal_counter_ = (this->horizontal_counter_ + window) % 0x390;
      } while (iStack_2c == next_event);
      if (iStack_2c == 0) {
        set_output_type(this,Sync,false);
        if (this->left_margin_ == 0) {
          this->is_sync_or_pixels_ = true;
        }
        if (this->right_margin_ == 0) {
          this->is_sync_or_pixels_ = false;
        }
      }
      this->last_read_ = 0xff;
      while (iStack_2c < 4 && iStack_2c < next_event) {
        if ((this->should_reload_line_parameters_ & 1U) != 0) {
          switch(iStack_2c) {
          case 0:
            this->lines_remaining_ = this->ram_[this->line_parameter_pointer_];
            this->last_read_ = this->ram_[(ulong)this->line_parameter_pointer_ + 1];
            this->interrupt_line_ =
                 (bool)(this->ram_[(ulong)this->line_parameter_pointer_ + 1] >> 7);
            this->mode_ = this->ram_[(ulong)this->line_parameter_pointer_ + 1] >> 1 & LPixel;
            this->bpp_ = 1 << (this->ram_[(ulong)this->line_parameter_pointer_ + 1] >> 5 & 3);
            switch(this->mode_) {
            case Attr:
              this->column_size_ = 8;
              this->line_data_per_column_increments_[0] = 1;
              this->line_data_per_column_increments_[1] = 1;
              break;
            case CH256:
            case CH128:
            case CH64:
            case LPixel:
              this->column_size_ = (int)(8 / (long)this->bpp_);
              this->line_data_per_column_increments_[0] = 1;
              this->line_data_per_column_increments_[1] = 0;
              break;
            default:
            case Pixel:
              this->column_size_ = (int)(0x10 / (long)this->bpp_);
              this->line_data_per_column_increments_[0] = 2;
              this->line_data_per_column_increments_[1] = 0;
            }
            this->vres_ = (this->ram_[(int)(this->line_parameter_pointer_ + 1)] & 0x10) != 0;
            this->reload_line_parameter_pointer_ =
                 (this->ram_[(int)(this->line_parameter_pointer_ + 1)] & 1) != 0;
            break;
          case 1:
            this->left_margin_ = this->ram_[(ulong)this->line_parameter_pointer_ + 2] & 0x3f;
            this->right_margin_ = this->ram_[(ulong)this->line_parameter_pointer_ + 3] & 0x3f;
            this->last_read_ = this->ram_[(ulong)this->line_parameter_pointer_ + 3];
            MVar1 = this->mode_;
            if (MVar1 == Pixel) {
LAB_0074e11a:
              base._3_1_ = this->ram_[(int)(this->line_parameter_pointer_ + 2)];
              this->two_colour_mask_ =
                   ((byte)((int)(base._3_1_ & 0x80) >> 7) | (base._3_1_ & 0x40) << 1) ^ 0xff;
              this->alt_ind_palettes[0] = this->palette_;
              iVar6 = 0;
              if ((base._3_1_ & 0x80) != 0) {
                iVar6 = 2;
              }
              this->alt_ind_palettes[2] = this->alt_ind_palettes[0] + iVar6;
              iVar6 = 0;
              if ((base._3_1_ & 0x40) != 0) {
                iVar6 = 4;
              }
              this->alt_ind_palettes[1] = this->alt_ind_palettes[0] + iVar6;
              iVar6 = 0;
              if ((base._3_1_ & 0x40) != 0) {
                iVar6 = 4;
              }
              this->alt_ind_palettes[3] = this->alt_ind_palettes[2] + iVar6;
            }
            else if (MVar1 - CH256 < 3) {
              base._2_1_ = this->ram_[(int)(this->line_parameter_pointer_ + 3)];
              this->alt_ind_palettes[0] = this->palette_;
              iVar6 = 0;
              if ((base._2_1_ & 0x40) != 0) {
                iVar6 = 2;
              }
              this->alt_ind_palettes[2] = this->alt_ind_palettes[0] + iVar6;
              iVar6 = 0;
              if ((base._2_1_ & 0x80) != 0) {
                iVar6 = 4;
              }
              this->alt_ind_palettes[1] = this->alt_ind_palettes[0] + iVar6;
              iVar6 = 0;
              if ((base._2_1_ & 0x80) != 0) {
                iVar6 = 4;
              }
              this->alt_ind_palettes[3] = this->alt_ind_palettes[2] + iVar6;
            }
            else if (MVar1 == LPixel) goto LAB_0074e11a;
            break;
          case 2:
            this->start_line_data_pointer_[0] =
                 (ushort)this->ram_[(int)(this->line_parameter_pointer_ + 4)];
            this->start_line_data_pointer_[0] =
                 this->start_line_data_pointer_[0] |
                 (ushort)this->ram_[(int)(this->line_parameter_pointer_ + 5)] << 8;
            this->line_data_pointer_[0] = this->start_line_data_pointer_[0];
            this->last_read_ = this->ram_[(int)(this->line_parameter_pointer_ + 5)];
            break;
          case 3:
            this->start_line_data_pointer_[1] =
                 (ushort)this->ram_[(int)(this->line_parameter_pointer_ + 6)];
            this->start_line_data_pointer_[1] =
                 this->start_line_data_pointer_[1] |
                 (ushort)this->ram_[(int)(this->line_parameter_pointer_ + 7)] << 8;
            this->line_data_pointer_[1] = this->start_line_data_pointer_[1];
            this->last_read_ = this->ram_[(int)(this->line_parameter_pointer_ + 7)];
          }
        }
        this->output_duration_ = this->output_duration_ + 1;
        this->line_data_pointer_[0] =
             this->line_data_pointer_[0] +
             (ushort)(this->is_sync_or_pixels_ & 1) *
             (short)this->line_data_per_column_increments_[0];
        this->line_data_pointer_[1] =
             this->line_data_pointer_[1] +
             (ushort)(this->is_sync_or_pixels_ & 1) *
             (short)this->line_data_per_column_increments_[1];
        iStack_2c = iStack_2c + 1;
        if ((iStack_2c != 0x39) && (iStack_2c == this->left_margin_)) {
          this->is_sync_or_pixels_ = true;
        }
        if ((iStack_2c != 0x39) && (iStack_2c == this->right_margin_)) {
          this->is_sync_or_pixels_ = false;
        }
      }
      if (iStack_2c == 4) {
        if (this->mode_ == Vsync) {
          set_output_type(this,(uint)((this->is_sync_or_pixels_ & 1U) == 0),false);
        }
        else {
          set_output_type(this,Blank,false);
        }
      }
      if (this->mode_ == Vsync) {
        if (3 < iStack_2c) {
          while (iStack_2c < next_event) {
            next_event_1 = next_event;
            if (iStack_2c < this->left_margin_) {
              piVar3 = std::min<int>(&next_event_1,&this->left_margin_);
              next_event_1 = *piVar3;
            }
            if (iStack_2c < this->right_margin_) {
              piVar3 = std::min<int>(&next_event_1,&this->right_margin_);
              next_event_1 = *piVar3;
            }
            this->output_duration_ = (next_event_1 - iStack_2c) + this->output_duration_;
            this->line_data_pointer_[0] =
                 this->line_data_pointer_[0] +
                 (ushort)(this->is_sync_or_pixels_ & 1) *
                 (short)this->line_data_per_column_increments_[0] *
                 ((short)next_event_1 - (short)iStack_2c);
            this->line_data_pointer_[1] =
                 this->line_data_pointer_[1] +
                 (ushort)(this->is_sync_or_pixels_ & 1) *
                 (short)this->line_data_per_column_increments_[1] *
                 ((short)next_event_1 - (short)iStack_2c);
            iStack_2c = next_event_1;
            if ((next_event_1 != 0x39) && (next_event_1 == this->left_margin_)) {
              this->is_sync_or_pixels_ = true;
            }
            if ((next_event_1 != 0x39) && (next_event_1 == this->right_margin_)) {
              this->is_sync_or_pixels_ = false;
            }
            set_output_type(this,(uint)((this->is_sync_or_pixels_ & 1U) == 0),false);
          }
        }
      }
      else {
        while (iStack_2c < this->first_pixel_window_ && iStack_2c < next_event) {
          if (iStack_2c == 6) {
            set_output_type(this,ColourBurst,false);
          }
          if (((this->should_reload_line_parameters_ & 1U) != 0) && (iStack_2c < 8)) {
            columns_remaining = (iStack_2c + -4) * 2;
            if (6 < columns_remaining) {
              __assert_fail("base < 7",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                            ,0x131,"void Enterprise::Nick::run_for(Cycles)");
            }
            uVar2 = anon_unknown.dwarf_aa827f::mapped_colour
                              (this->ram_
                               [(int)((uint)this->line_parameter_pointer_ + columns_remaining + 8)])
            ;
            this->palette_[columns_remaining] = uVar2;
            uVar2 = anon_unknown.dwarf_aa827f::mapped_colour
                              (this->ram_
                               [(int)((uint)this->line_parameter_pointer_ + columns_remaining + 9)])
            ;
            this->palette_[columns_remaining + 1] = uVar2;
            this->last_read_ =
                 this->ram_[(int)((uint)this->line_parameter_pointer_ + columns_remaining + 9)];
          }
          this->output_duration_ = this->output_duration_ + 1;
          this->line_data_pointer_[0] =
               this->line_data_pointer_[0] +
               (ushort)(this->is_sync_or_pixels_ & 1) *
               (short)this->line_data_per_column_increments_[0];
          this->line_data_pointer_[1] =
               this->line_data_pointer_[1] +
               (ushort)(this->is_sync_or_pixels_ & 1) *
               (short)this->line_data_per_column_increments_[1];
          iStack_2c = iStack_2c + 1;
          if ((iStack_2c != 0x39) && (iStack_2c == this->left_margin_)) {
            this->is_sync_or_pixels_ = true;
          }
          if ((iStack_2c != 0x39) && (iStack_2c == this->right_margin_)) {
            this->is_sync_or_pixels_ = false;
          }
        }
        if (this->first_pixel_window_ <= iStack_2c) {
          if (iStack_2c == this->first_pixel_window_) {
            OVar7 = Border;
            if ((this->is_sync_or_pixels_ & 1U) != 0) {
              OVar7 = Pixels;
            }
            set_output_type(this,OVar7,false);
          }
          while (iStack_2c < next_event) {
            output_duration = next_event;
            if (iStack_2c < this->left_margin_) {
              piVar3 = std::min<int>(&output_duration,&this->left_margin_);
              output_duration = *piVar3;
            }
            if (iStack_2c < this->right_margin_) {
              piVar3 = std::min<int>(&output_duration,&this->right_margin_);
              output_duration = *piVar3;
            }
            if ((this->is_sync_or_pixels_ & 1U) == 0) {
              this->output_duration_ = (output_duration - iStack_2c) + this->output_duration_;
              this->line_data_pointer_[0] =
                   this->line_data_pointer_[0] +
                   (ushort)(this->is_sync_or_pixels_ & 1) *
                   (short)this->line_data_per_column_increments_[0] *
                   ((short)output_duration - (short)iStack_2c);
              this->line_data_pointer_[1] =
                   this->line_data_pointer_[1] +
                   (ushort)(this->is_sync_or_pixels_ & 1) *
                   (short)this->line_data_per_column_increments_[1] *
                   ((short)output_duration - (short)iStack_2c);
              iStack_2c = output_duration;
              if ((output_duration != 0x39) && (output_duration == this->left_margin_)) {
                this->is_sync_or_pixels_ = true;
              }
              if ((output_duration != 0x39) && (output_duration == this->right_margin_)) {
                this->is_sync_or_pixels_ = false;
              }
            }
            else {
              local_44 = output_duration - iStack_2c;
              while (local_44 != 0) {
                if (this->pixel_pointer_ == (uint16_t *)0x0) {
                  if (this->output_duration_ != 0) {
                    set_output_type(this,Pixels,true);
                  }
                  puVar4 = (uint16_t *)Outputs::CRT::CRT::begin_data(&this->crt_,0x150,1);
                  this->allocated_pointer_ = puVar4;
                  this->pixel_pointer_ = puVar4;
                }
                if (this->allocated_pointer_ == (uint16_t *)0x0) {
                  this->output_duration_ = local_44 + this->output_duration_;
                  this->line_data_pointer_[0] =
                       this->line_data_pointer_[0] +
                       (ushort)(this->is_sync_or_pixels_ & 1) *
                       (short)this->line_data_per_column_increments_[0] * (short)local_44;
                  this->line_data_pointer_[1] =
                       this->line_data_pointer_[1] +
                       (ushort)(this->is_sync_or_pixels_ & 1) *
                       (short)this->line_data_per_column_increments_[1] * (short)local_44;
                  iStack_2c = local_44 + iStack_2c;
                  if ((iStack_2c != 0x39) && (iStack_2c == this->left_margin_)) {
                    this->is_sync_or_pixels_ = true;
                  }
                  if ((iStack_2c != 0x39) && (iStack_2c == this->right_margin_)) {
                    this->is_sync_or_pixels_ = false;
                  }
                  local_44 = 0;
                }
                else {
                  uVar5 = (ulong)((long)this->allocated_pointer_ +
                                 (0x2a0 - (long)this->pixel_pointer_)) >> 1;
                  local_4c = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 |
                                         uVar5 & 0xffffffff) / (long)this->column_size_);
                  piVar3 = std::min<int>(&local_44,&local_4c);
                  local_48 = *piVar3;
                  switch(this->mode_) {
                  case Attr:
                    switch(this->bpp_) {
                    case 2:
                      output_attributed<2>(this,this->pixel_pointer_,local_48);
                      break;
                    default:
                    case 1:
                      output_attributed<1>(this,this->pixel_pointer_,local_48);
                      break;
                    case 4:
                      output_attributed<4>(this,this->pixel_pointer_,local_48);
                      break;
                    case 8:
                      output_attributed<8>(this,this->pixel_pointer_,local_48);
                    }
                    break;
                  case CH256:
                    switch(this->bpp_) {
                    case 2:
                      output_character<2,8>(this,this->pixel_pointer_,local_48);
                      break;
                    default:
                    case 1:
                      output_character<1,8>(this,this->pixel_pointer_,local_48);
                      break;
                    case 4:
                      output_character<4,8>(this,this->pixel_pointer_,local_48);
                      break;
                    case 8:
                      output_character<8,8>(this,this->pixel_pointer_,local_48);
                    }
                    break;
                  case CH128:
                    switch(this->bpp_) {
                    case 2:
                      output_character<2,7>(this,this->pixel_pointer_,local_48);
                      break;
                    default:
                    case 1:
                      output_character<1,7>(this,this->pixel_pointer_,local_48);
                      break;
                    case 4:
                      output_character<4,7>(this,this->pixel_pointer_,local_48);
                      break;
                    case 8:
                      output_character<8,7>(this,this->pixel_pointer_,local_48);
                    }
                    break;
                  case CH64:
                    switch(this->bpp_) {
                    case 2:
                      output_character<2,6>(this,this->pixel_pointer_,local_48);
                      break;
                    default:
                    case 1:
                      output_character<1,6>(this,this->pixel_pointer_,local_48);
                      break;
                    case 4:
                      output_character<4,6>(this,this->pixel_pointer_,local_48);
                      break;
                    case 8:
                      output_character<8,6>(this,this->pixel_pointer_,local_48);
                    }
                    break;
                  default:
                  case Pixel:
                    switch(this->bpp_) {
                    case 2:
                      output_pixel<2,false>(this,this->pixel_pointer_,local_48);
                      break;
                    default:
                    case 1:
                      output_pixel<1,false>(this,this->pixel_pointer_,local_48);
                      break;
                    case 4:
                      output_pixel<4,false>(this,this->pixel_pointer_,local_48);
                      break;
                    case 8:
                      output_pixel<8,false>(this,this->pixel_pointer_,local_48);
                    }
                    break;
                  case LPixel:
                    switch(this->bpp_) {
                    case 2:
                      output_pixel<2,true>(this,this->pixel_pointer_,local_48);
                      break;
                    default:
                    case 1:
                      output_pixel<1,true>(this,this->pixel_pointer_,local_48);
                      break;
                    case 4:
                      output_pixel<4,true>(this,this->pixel_pointer_,local_48);
                      break;
                    case 8:
                      output_pixel<8,true>(this,this->pixel_pointer_,local_48);
                    }
                  }
                  this->pixel_pointer_ = this->pixel_pointer_ + local_48 * this->column_size_;
                  this->output_duration_ = local_48 + this->output_duration_;
                  if ((long)this->pixel_pointer_ - (long)this->allocated_pointer_ >> 1 == 0x150) {
                    set_output_type(this,Pixels,true);
                  }
                  local_44 = local_44 - local_48;
                  this->line_data_pointer_[0] =
                       this->line_data_pointer_[0] +
                       (ushort)(this->is_sync_or_pixels_ & 1) *
                       (short)this->line_data_per_column_increments_[0] * (short)local_48;
                  this->line_data_pointer_[1] =
                       this->line_data_pointer_[1] +
                       (ushort)(this->is_sync_or_pixels_ & 1) *
                       (short)this->line_data_per_column_increments_[1] * (short)local_48;
                  iStack_2c = local_48 + iStack_2c;
                  if ((iStack_2c != 0x39) && (iStack_2c == this->left_margin_)) {
                    this->is_sync_or_pixels_ = true;
                  }
                  if ((iStack_2c != 0x39) && (iStack_2c == this->right_margin_)) {
                    this->is_sync_or_pixels_ = false;
                  }
                }
              }
            }
            OVar7 = Border;
            if ((this->is_sync_or_pixels_ & 1U) != 0) {
              OVar7 = Pixels;
            }
            set_output_type(this,OVar7,false);
          }
        }
      }
    } while (this->horizontal_counter_ != 0);
    if (iStack_2c != 0x39) {
      __assert_fail("window == 57",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                    ,0x18e,"void Enterprise::Nick::run_for(Cycles)");
    }
    this->lines_remaining_ = this->lines_remaining_ + '\x01';
    if (this->lines_remaining_ == '\0') {
      this->should_reload_line_parameters_ = true;
      if ((this->reload_line_parameter_pointer_ & 1U) == 0) {
        this->line_parameter_pointer_ = this->line_parameter_pointer_ + 0x10;
      }
      else {
        this->line_parameter_pointer_ = this->line_parameter_base_;
      }
    }
    else {
      this->should_reload_line_parameters_ = false;
    }
    MVar1 = this->mode_;
    if (MVar1 - Pixel < 2) {
LAB_0074f049:
      if ((this->vres_ & 1U) == 0) {
        this->line_data_pointer_[0] = this->start_line_data_pointer_[0];
      }
      goto LAB_0074ddce;
    }
    if (MVar1 - CH256 < 3) {
      this->line_data_pointer_[0] = this->start_line_data_pointer_[0];
      this->line_data_pointer_[1] = this->line_data_pointer_[1] + 1;
    }
    else if (MVar1 == LPixel) goto LAB_0074f049;
  } while( true );
}

Assistant:

void Nick::run_for(Cycles duration) {
	constexpr int line_length = 912;

#define add_window(x)															\
	line_data_pointer_[0] += is_sync_or_pixels_ * line_data_per_column_increments_[0] * (x);	\
	line_data_pointer_[1] += is_sync_or_pixels_ * line_data_per_column_increments_[1] * (x);	\
	window += x;																\
	if(window != 57 && window == left_margin_) is_sync_or_pixels_ = true;		\
	if(window != 57 && window == right_margin_) is_sync_or_pixels_ = false;

	int clocks_remaining = duration.as<int>();
	while(clocks_remaining) {
		// Determine how many cycles are left this line.
		const int clocks_this_line = std::min(clocks_remaining, line_length - horizontal_counter_);

		// Convert that into a [start/current] and end window.
		int window = horizontal_counter_ >> 4;
		const int end_window = (horizontal_counter_ + clocks_this_line) >> 4;

		// Advance the line counters.
		clocks_remaining -= clocks_this_line;
		horizontal_counter_ = (horizontal_counter_ + clocks_this_line) % line_length;

		// Do nothing if a window boundary isn't crossed.
		if(window == end_window) continue;

		// HSYNC is signalled for four windows at the start of the line.
		// I currently believe this happens regardless of Vsync mode.
		if(!window) {
			set_output_type(OutputType::Sync);

			// There's no increment to get to 0, it happens when the horizontal_counter_
			// is reset. So test for active bit effect manually.
			if(!left_margin_) is_sync_or_pixels_ = true;
			if(!right_margin_) is_sync_or_pixels_ = false;
		}

		// Default to noting read.
		last_read_ = 0xff;

		while(window < 4 && window < end_window) {
			if(should_reload_line_parameters_) {
				switch(window) {
					// First slot: line count, mode and interrupt flag.
					case 0:
						// Byte 0: lines remaining.
						lines_remaining_ = ram_[line_parameter_pointer_];

						// Byte 1: current interrupt output plus graphics modes...
						last_read_ = ram_[line_parameter_pointer_ + 1];

						// Set the new interrupt line output.
						interrupt_line_ = ram_[line_parameter_pointer_ + 1] & 0x80;

						// Determine the mode and depth, and hence the column size.
						mode_ = Mode((ram_[line_parameter_pointer_ + 1] >> 1)&7);
						bpp_ = 1 << ((ram_[line_parameter_pointer_ + 1] >> 5)&3);
						switch(mode_) {
							default:
							case Mode::Pixel:
								column_size_ = 16 / bpp_;
								line_data_per_column_increments_[0] = 2;
								line_data_per_column_increments_[1] = 0;
							break;

							case Mode::LPixel:
							case Mode::CH64:
							case Mode::CH128:
							case Mode::CH256:
								column_size_ = 8 / bpp_;
								line_data_per_column_increments_[0] = 1;
								line_data_per_column_increments_[1] = 0;
							break;

							case Mode::Attr:
								column_size_ = 8;
								line_data_per_column_increments_[0] = 1;
								line_data_per_column_increments_[1] = 1;
							break;
						}

						vres_ = ram_[line_parameter_pointer_ + 1] & 0x10;
						reload_line_parameter_pointer_ = ram_[line_parameter_pointer_ + 1] & 0x01;
					break;

					// Second slot: margins and ALT/IND bits.
					case 1:
						// Determine the margins.
						left_margin_ = ram_[line_parameter_pointer_ + 2] & 0x3f;
						right_margin_ = ram_[line_parameter_pointer_ + 3] & 0x3f;
						last_read_ = ram_[line_parameter_pointer_ + 3];

						// Set up the alternative palettes,
						switch(mode_) {
							default:
							break;

							// NB: LSBALT/MSBALT and ALTIND0/ALTIND1 appear to have opposite effects on palette selection.

							case Mode::Pixel:
							case Mode::LPixel: {
								const uint8_t flags = ram_[line_parameter_pointer_ + 2];

								// Use MSBALT and LSBALT to pick the alt_ind_palettes.
								//
								// LSBALT = b6 of params[2], if set => character codes with bit 6 set should use palette indices 4... instead of 0... .
								// MSBALT = b7 of params[2], if set => character codes with bit 7 set should use palette indices 2 and 3.
								two_colour_mask_ = 0xff &~ (((flags&0x80) >> 7) | ((flags&0x40) << 1));

								alt_ind_palettes[0] = palette_;
								alt_ind_palettes[2] = alt_ind_palettes[0] + ((flags & 0x80) ? 2 : 0);

								alt_ind_palettes[1] = alt_ind_palettes[0] + ((flags & 0x40) ? 4 : 0);
								alt_ind_palettes[3] = alt_ind_palettes[2] + ((flags & 0x40) ? 4 : 0);
							} break;

							case Mode::CH64:
							case Mode::CH128:
							case Mode::CH256: {
								const uint8_t flags = ram_[line_parameter_pointer_ + 3];

								// Use ALTIND0 and ALTIND1 to pick the alt_ind_palettes.
								//
								// ALTIND1 = b6 of params[3], if set => character codes with bit 7 set should use palette indices 2 and 3.
								// ALTIND0 = b7 of params[3], if set => character codes with bit 6 set should use palette indices 4... instead of 0... .
								alt_ind_palettes[0] = palette_;
								alt_ind_palettes[2] = alt_ind_palettes[0] + ((flags & 0x40) ? 2 : 0);

								alt_ind_palettes[1] = alt_ind_palettes[0] + ((flags & 0x80) ? 4 : 0);
								alt_ind_palettes[3] = alt_ind_palettes[2] + ((flags & 0x80) ? 4 : 0);
							} break;
						}
					break;

					// Third slot: Line data pointer 1.
					case 2:
						start_line_data_pointer_[0] = ram_[line_parameter_pointer_ + 4];
						start_line_data_pointer_[0] |= ram_[line_parameter_pointer_ + 5] << 8;

						line_data_pointer_[0] = start_line_data_pointer_[0];
						last_read_ = ram_[line_parameter_pointer_ + 5];
					break;

					// Fourth slot: Line data pointer 2.
					case 3:
						start_line_data_pointer_[1] = ram_[line_parameter_pointer_ + 6];
						start_line_data_pointer_[1] |= ram_[line_parameter_pointer_ + 7] << 8;

						line_data_pointer_[1] = start_line_data_pointer_[1];
						last_read_ = ram_[line_parameter_pointer_ + 7];
					break;
				}
			}

			++output_duration_;
			add_window(1);
		}
		if(window == 4) {
			if(mode_ == Mode::Vsync) {
				set_output_type(is_sync_or_pixels_ ? OutputType::Sync : OutputType::Blank);
			} else {
				set_output_type(OutputType::Blank);
			}
		}

		// Deal with vsync mode out here.
		if(mode_ == Mode::Vsync) {
			if(window >= 4) {
				while(window < end_window) {
					// Skip straight to the next event.
					int next_event = end_window;
					if(window < left_margin_) next_event = std::min(next_event, left_margin_);
					if(window < right_margin_) next_event = std::min(next_event, right_margin_);

					output_duration_ += next_event - window;
					add_window(next_event - window);
					set_output_type(is_sync_or_pixels_ ? OutputType::Sync : OutputType::Blank);
				}
			}
		} else {
			// If present then the colour burst is output for the period from
			// the start of window 6 to the end of window 10.
			//
			// The first 8 palette entries also need to be fetched here.
			while(window < first_pixel_window_ && window < end_window) {
				if(window == 6) {
					set_output_type(OutputType::ColourBurst);
				}

				if(should_reload_line_parameters_ && window < 8) {
					const int base = (window - 4) << 1;
					assert(base < 7);
					palette_[base] = mapped_colour(ram_[line_parameter_pointer_ + base + 8]);
					palette_[base + 1] = mapped_colour(ram_[line_parameter_pointer_ + base + 9]);
					last_read_ = ram_[line_parameter_pointer_ + base + 9];
				}

				++output_duration_;
				add_window(1);
			}

			if(window >= first_pixel_window_) {
				if(window == first_pixel_window_) {
					set_output_type(is_sync_or_pixels_ ? OutputType::Pixels : OutputType::Border);
				}

				while(window < end_window) {
					int next_event = end_window;
					if(window < left_margin_) next_event = std::min(next_event, left_margin_);
					if(window < right_margin_) next_event = std::min(next_event, right_margin_);

					if(is_sync_or_pixels_) {

#define DispatchBpp(func) \
	switch(bpp_) {	\
		default:	\
		case 1: func(1)(pixel_pointer_, output_duration);	break;	\
		case 2: func(2)(pixel_pointer_, output_duration);	break;	\
		case 4: func(4)(pixel_pointer_, output_duration);	break;	\
		case 8: func(8)(pixel_pointer_, output_duration);	break;	\
	}

#define pixel(x) output_pixel<x, false>
#define lpixel(x) output_pixel<x, true>
#define ch256(x) output_character<x, 8>
#define ch128(x) output_character<x, 7>
#define ch64(x) output_character<x, 6>
#define attr(x) output_attributed<x>

						int columns_remaining = next_event - window;
						while(columns_remaining) {
							if(!pixel_pointer_) {
								if(output_duration_) {
									set_output_type(OutputType::Pixels, true);
								}
								pixel_pointer_ = allocated_pointer_ = reinterpret_cast<uint16_t *>(crt_.begin_data(allocation_size));
							}

							if(allocated_pointer_) {
								const int output_duration = std::min(columns_remaining, int(allocated_pointer_ + allocation_size - pixel_pointer_) / column_size_);

								switch(mode_) {
									default:
									case Mode::Pixel:	DispatchBpp(pixel);		break;
									case Mode::LPixel:	DispatchBpp(lpixel);	break;
									case Mode::CH256:	DispatchBpp(ch256);		break;
									case Mode::CH128:	DispatchBpp(ch128);		break;
									case Mode::CH64:	DispatchBpp(ch64);		break;
									case Mode::Attr:	DispatchBpp(attr);		break;
								}

								pixel_pointer_ += output_duration * column_size_;
								output_duration_ += output_duration;
								if(pixel_pointer_ - allocated_pointer_ == allocation_size) {
									set_output_type(OutputType::Pixels, true);
								}
								columns_remaining -= output_duration;
								add_window(output_duration);
							} else {
								output_duration_ += columns_remaining;
								add_window(columns_remaining);
								columns_remaining = 0;
							}
						}

#undef attr
#undef ch64
#undef ch128
#undef ch256
#undef pixel
#undef lpixel
#undef DispatchBpp
					} else {
						output_duration_ += next_event - window;
						add_window(next_event - window);
					}

					set_output_type(is_sync_or_pixels_ ? OutputType::Pixels : OutputType::Border);
				}
			}
		}

		// Check for end of line.
		if(!horizontal_counter_) {
			assert(window == 57);

			++lines_remaining_;
			if(!lines_remaining_) {
				should_reload_line_parameters_ = true;

				// Check for end-of-frame.
				if(reload_line_parameter_pointer_) {
					line_parameter_pointer_ = line_parameter_base_;
				} else {
					line_parameter_pointer_ += 16;
				}
			} else {
				should_reload_line_parameters_ = false;
			}

			// Deal with VRES and other address reloading, dependant upon mode.
			switch(mode_) {
				default: break;
				case Mode::CH64:
				case Mode::CH128:
				case Mode::CH256:
					line_data_pointer_[0] = start_line_data_pointer_[0];
					++line_data_pointer_[1];
				break;

				case Mode::Pixel:
				case Mode::LPixel:
				case Mode::Attr:
					// Reload the pixel or attribute address if VRES is clear.
					if(!vres_) {
						line_data_pointer_[0] = start_line_data_pointer_[0];
					}
				break;
			}
		}
	}

#undef add_window

}